

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BitMatrix.h
# Opt level: O1

bool __thiscall ZXing::BitMatrix::get(BitMatrix *this,int x,int y)

{
  pointer __s;
  undefined1 extraout_AL;
  undefined1 uVar1;
  byte *extraout_RDX;
  ulong __n;
  char *pcVar3;
  pointer puVar4;
  void *pvVar2;
  
  __n = (ulong)(y * *(int *)this + x);
  if (__n < (ulong)(*(long *)(this + 0x10) - *(long *)(this + 8))) {
    return *(char *)(*(long *)(this + 8) + __n) != '\0';
  }
  pcVar3 = "vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)";
  std::__throw_out_of_range_fmt
            ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)");
  if (-1 < (long)__n) {
    (((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)pcVar3)->_M_impl).
    super__Vector_impl_data._M_start = (pointer)0x0;
    (((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)pcVar3)->_M_impl).
    super__Vector_impl_data._M_finish = (pointer)0x0;
    (((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)pcVar3)->_M_impl).
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::_M_create_storage
              ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)pcVar3,__n);
    __s = (((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)pcVar3)->_M_impl).
          super__Vector_impl_data._M_start;
    puVar4 = __s;
    uVar1 = extraout_AL;
    if (__n != 0) {
      puVar4 = __s + __n;
      pvVar2 = memset(__s,(uint)*extraout_RDX,__n);
      uVar1 = SUB81(pvVar2,0);
    }
    (((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)pcVar3)->_M_impl).
    super__Vector_impl_data._M_finish = puVar4;
    return (bool)uVar1;
  }
  pcVar3 = "cannot create std::vector larger than max_size()";
  std::__throw_length_error("cannot create std::vector larger than max_size()");
  if (__n == 0) {
    pvVar2 = (void *)0x0;
  }
  else {
    if ((long)__n < 0) {
      std::__throw_bad_alloc();
      halt_baddata();
    }
    pvVar2 = operator_new(__n);
  }
  *(void **)pcVar3 = pvVar2;
  *(void **)(pcVar3 + 8) = pvVar2;
  *(ulong *)(pcVar3 + 0x10) = __n + (long)pvVar2;
  return SUB81(pvVar2,0);
}

Assistant:

bool get(int x, int y) const { return get(y * _width + x); }